

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O2

long __thiscall glcts::anon_unknown_0::BasicResourceTexture::Cleanup(BasicResourceTexture *this)

{
  CallLogWrapper *this_00;
  
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glActiveTexture(this_00,0x84c0);
  glu::CallLogWrapper::glUseProgram(this_00,0);
  glu::CallLogWrapper::glDeleteProgram(this_00,this->m_program);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->m_storage_buffer);
  glu::CallLogWrapper::glDeleteTextures(this_00,3,this->m_texture);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->m_dispatch_buffer);
  return 0;
}

Assistant:

virtual long Cleanup()
	{
		glActiveTexture(GL_TEXTURE0);
		glUseProgram(0);
		glDeleteProgram(m_program);
		glDeleteBuffers(1, &m_storage_buffer);
		glDeleteTextures(3, m_texture);
		glDeleteBuffers(1, &m_dispatch_buffer);
		return NO_ERROR;
	}